

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void paint_grid(void)

{
  WindowHandle h_wnd;
  bool bVar1;
  uchar uVar2;
  int iVar3;
  size_type sVar4;
  byte *pbVar5;
  reference puVar6;
  uchar *bytes;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  iterator im_it;
  iterator it_end;
  iterator it;
  int nr_bytes;
  
  iVar3 = grid.width * grid.height;
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&image);
  if (sVar4 != (long)iVar3) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&image,(long)iVar3);
  }
  it_end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&grid.cells);
  im_it = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&grid.cells);
  local_28._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&image);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&it_end,&im_it);
    h_wnd = wh;
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator++(&it_end,0);
    pbVar5 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_30);
    uVar2 = 0xff;
    if ((*pbVar5 & 1) != 0) {
      uVar2 = '\0';
    }
    local_38 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator++(&local_28,0);
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_38);
    *puVar6 = uVar2;
  }
  bytes = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&image);
  paint(h_wnd,bytes,grid.width,grid.height,1);
  return;
}

Assistant:

void paint_grid()
  {
  const int nr_bytes = grid.width*grid.height;
  if (image.size() != nr_bytes)
    image.resize(nr_bytes);
  auto it = grid.cells.begin();
  auto it_end = grid.cells.end();
  auto im_it = image.begin();
  while (it != it_end)    
    *im_it++ = (*it++ & 1) ? 0 : 255;    
  paint(wh, image.data(), grid.width, grid.height, 1);
  }